

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

int ma_itoa_s(int value,char *dst,size_t dstSizeInBytes,int radix)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  bool local_37;
  char temp;
  int remainder;
  char *dstEnd;
  uint valueU;
  int sign;
  int radix_local;
  size_t dstSizeInBytes_local;
  char *dst_local;
  int value_local;
  int local_4;
  
  if ((dst == (char *)0x0) || (dstSizeInBytes == 0)) {
    local_4 = 0x16;
  }
  else if ((radix < 2) || (0x24 < radix)) {
    *dst = '\0';
    local_4 = 0x16;
  }
  else {
    iVar2 = 1;
    if (value < 0 && radix == 10) {
      iVar2 = -1;
    }
    pcVar3 = dst;
    valueU = value;
    sVar4 = dstSizeInBytes;
    if (value < 0) {
      valueU = -value;
      pcVar3 = dst;
      sVar4 = dstSizeInBytes;
    }
    do {
      dstSizeInBytes_local = sVar4;
      dstEnd = pcVar3;
      cVar1 = (char)(valueU % (uint)radix);
      if ((int)(valueU % (uint)radix) < 10) {
        *dstEnd = cVar1 + '0';
      }
      else {
        *dstEnd = cVar1 + 'W';
      }
      pcVar3 = dstEnd + 1;
      sVar4 = dstSizeInBytes_local - 1;
      valueU = valueU / (uint)radix;
      local_37 = sVar4 != 0 && valueU != 0;
    } while (local_37);
    if (sVar4 == 0) {
      *dst = '\0';
      local_4 = 0x16;
    }
    else {
      if (iVar2 < 0) {
        *pcVar3 = '-';
        pcVar3 = dstEnd + 2;
        sVar4 = dstSizeInBytes_local - 2;
      }
      dstSizeInBytes_local = sVar4;
      dstEnd = pcVar3;
      if (dstSizeInBytes_local == 0) {
        *dst = '\0';
        local_4 = 0x16;
      }
      else {
        *dstEnd = '\0';
        for (dst_local = dst; dstEnd = dstEnd + -1, dst_local < dstEnd; dst_local = dst_local + 1) {
          cVar1 = *dst_local;
          *dst_local = *dstEnd;
          *dstEnd = cVar1;
        }
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

MA_API MA_NO_INLINE int ma_itoa_s(int value, char* dst, size_t dstSizeInBytes, int radix)
{
    int sign;
    unsigned int valueU;
    char* dstEnd;

    if (dst == NULL || dstSizeInBytes == 0) {
        return 22;
    }
    if (radix < 2 || radix > 36) {
        dst[0] = '\0';
        return 22;
    }

    sign = (value < 0 && radix == 10) ? -1 : 1;     /* The negative sign is only used when the base is 10. */

    if (value < 0) {
        valueU = -value;
    } else {
        valueU = value;
    }

    dstEnd = dst;
    do
    {
        int remainder = valueU % radix;
        if (remainder > 9) {
            *dstEnd = (char)((remainder - 10) + 'a');
        } else {
            *dstEnd = (char)(remainder + '0');
        }

        dstEnd += 1;
        dstSizeInBytes -= 1;
        valueU /= radix;
    } while (dstSizeInBytes > 0 && valueU > 0);

    if (dstSizeInBytes == 0) {
        dst[0] = '\0';
        return 22;  /* Ran out of room in the output buffer. */
    }

    if (sign < 0) {
        *dstEnd++ = '-';
        dstSizeInBytes -= 1;
    }

    if (dstSizeInBytes == 0) {
        dst[0] = '\0';
        return 22;  /* Ran out of room in the output buffer. */
    }

    *dstEnd = '\0';


    /* At this point the string will be reversed. */
    dstEnd -= 1;
    while (dst < dstEnd) {
        char temp = *dst;
        *dst = *dstEnd;
        *dstEnd = temp;

        dst += 1;
        dstEnd -= 1;
    }

    return 0;
}